

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O2

void write_image_inside(Fl_RGB_Image *to,Fl_RGB_Image *from,int to_x,int to_y)

{
  int iVar1;
  size_t __n;
  int j;
  int iVar2;
  int iVar3;
  uchar *__src;
  int iVar4;
  uchar *__dest;
  
  iVar1 = (to->super_Fl_Image).ld_;
  if (iVar1 == 0) {
    iVar1 = (to->super_Fl_Image).d_ * (to->super_Fl_Image).w_;
  }
  iVar3 = (from->super_Fl_Image).ld_;
  if (iVar3 == 0) {
    iVar3 = (from->super_Fl_Image).d_ * (from->super_Fl_Image).w_;
  }
  iVar4 = (from->super_Fl_Image).h_;
  __src = from->array + (iVar4 + -1) * iVar3;
  __dest = to->array + (long)to_x * (long)(to->super_Fl_Image).d_ + (long)(to_y * iVar1);
  for (; 0 < iVar4; iVar4 = iVar4 + -1) {
    iVar2 = (from->super_Fl_Image).d_;
    if (iVar2 == (to->super_Fl_Image).d_) {
      memcpy(__dest,__src,(long)(from->super_Fl_Image).w_ * (long)iVar2);
    }
    else {
      for (iVar2 = 0; iVar2 < (from->super_Fl_Image).w_; iVar2 = iVar2 + 1) {
        __n = (size_t)(from->super_Fl_Image).d_;
        memcpy(__dest + (long)(to->super_Fl_Image).d_ * (long)iVar2,__src + (long)iVar2 * __n,__n);
      }
    }
    __dest = __dest + iVar1;
    __src = __src + -(long)iVar3;
  }
  return;
}

Assistant:

static void write_image_inside(Fl_RGB_Image *to, Fl_RGB_Image *from, int to_x, int to_y)
/* Copy the image "from" inside image "to" with its top-left angle at coordinates to_x, to_y.
 Also, exchange top and bottom of "from". Image depth can differ between "to" and "from".
 */
{
  int to_ld = (to->ld() == 0? to->w() * to->d() : to->ld());
  int from_ld = (from->ld() == 0? from->w() * from->d() : from->ld());
  uchar *tobytes = (uchar*)to->array + to_y * to_ld + to_x * to->d();
  const uchar *frombytes = from->array + (from->h() - 1) * from_ld;
  for (int i = from->h() - 1; i >= 0; i--) {
    if (from->d() == to->d()) memcpy(tobytes, frombytes, from->w() * from->d());
    else {
      for (int j = 0; j < from->w(); j++) {
        memcpy(tobytes + j * to->d(), frombytes + j * from->d(), from->d());
      }
    }
    tobytes += to_ld;
    frombytes -= from_ld;
  }
}